

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase629::run(TestCase629 *this)

{
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  Builder value_04;
  Builder value_05;
  Builder value_06;
  Builder *params;
  Builder *params_00;
  Builder *params_01;
  Builder *params_02;
  Builder *params_03;
  Builder *params_04;
  Builder *params_05;
  Builder *params_06;
  Reader value_07;
  Reader value_08;
  Array<char> local_348;
  StringTree local_330;
  char *local_2f8;
  Builder root;
  DebugComparison<const_char_(&)[24],_kj::String> _kjCondition;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestUnnamedUnion>
            (&root,&builder.super_MessageBuilder);
  *(undefined2 *)((long)root._builder.data + 4) = 1;
  *(undefined4 *)((long)root._builder.data + 8) = 0x7b;
  local_348.ptr = "(middle = 0, bar = 123)";
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)&local_330,(kj *)&root,params);
  kj::_::DebugExpression<char_const(&)[24]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[24]> *)&local_348,(String *)&local_330);
  kj::Array<char>::~Array((Array<char> *)&local_330);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
              ((String *)&local_330,(kj *)&root,params_00);
    kj::_::Debug::
    log<char_const(&)[64],kj::_::DebugComparison<char_const(&)[24],kj::String>&,char_const(&)[24],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x27b,ERROR,
               "\"failed: expected \" \"(\\\"(middle = 0, bar = 123)\\\") == (kj::str(root))\", _kjCondition, \"(middle = 0, bar = 123)\", kj::str(root)"
               ,(char (*) [64])"failed: expected (\"(middle = 0, bar = 123)\") == (kj::str(root))",
               &_kjCondition,(char (*) [24])"(middle = 0, bar = 123)",(String *)&local_330);
    kj::Array<char>::~Array((Array<char> *)&local_330);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  local_2f8 = "(middle = 0, bar = 123)";
  value.builder.segment = (SegmentBuilder *)root._builder.capTable;
  value.schema.super_Schema.raw = (Schema)(Schema)root._builder.segment;
  value.builder.capTable = (CapTableBuilder *)root._builder.data;
  value.builder.data = root._builder.pointers;
  value.builder.pointers = (WirePointer *)root._builder._32_8_;
  value.builder._32_8_ = _kjCondition.left;
  prettyPrint(value);
  kj::StringTree::flatten((String *)&local_348,&local_330);
  kj::_::DebugExpression<char_const(&)[24]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[24]> *)&local_2f8,(String *)&local_348);
  kj::Array<char>::~Array(&local_348);
  kj::StringTree::~StringTree(&local_330);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_00.builder.segment = (SegmentBuilder *)root._builder.capTable;
    value_00.schema.super_Schema.raw = (Schema)(Schema)root._builder.segment;
    value_00.builder.capTable = (CapTableBuilder *)root._builder.data;
    value_00.builder.data = root._builder.pointers;
    value_00.builder.pointers = (WirePointer *)root._builder._32_8_;
    value_00.builder._32_8_ = _kjCondition.left;
    prettyPrint(value_00);
    kj::StringTree::flatten((String *)&local_348,&local_330);
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<char_const(&)[24],kj::String>&,char_const(&)[24],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x27c,ERROR,
               "\"failed: expected \" \"(\\\"(middle = 0, bar = 123)\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"(middle = 0, bar = 123)\", prettyPrint(root).flatten()"
               ,(char (*) [78])
                "failed: expected (\"(middle = 0, bar = 123)\") == (prettyPrint(root).flatten())",
               &_kjCondition,(char (*) [24])"(middle = 0, bar = 123)",(String *)&local_348);
    kj::Array<char>::~Array(&local_348);
    kj::StringTree::~StringTree(&local_330);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  value_07.super_StringPtr.content.size_ = 0x22;
  value_07.super_StringPtr.content.ptr = "foooooooooooooooooooooooooooooooo";
  capnproto_test::capnp::test::TestUnnamedUnion::Builder::setAfter(&root,value_07);
  local_348.ptr = "(middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")";
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)&local_330,(kj *)&root,params_01);
  kj::_::DebugExpression<char_const(&)[69]>::operator==
            ((DebugComparison<const_char_(&)[69],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[69]> *)&local_348,(String *)&local_330);
  kj::Array<char>::~Array((Array<char> *)&local_330);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
              ((String *)&local_330,(kj *)&root,params_02);
    kj::_::Debug::
    log<char_const(&)[111],kj::_::DebugComparison<char_const(&)[69],kj::String>&,char_const(&)[69],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x281,ERROR,
               "\"failed: expected \" \"(\\\"(middle = 0, bar = 123, after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\")\\\") == (kj::str(root))\", _kjCondition, \"(middle = 0, bar = 123, after = \\\"foooooooooooooooooooooooooooooooo\\\")\", kj::str(root)"
               ,(char (*) [111])
                "failed: expected (\"(middle = 0, bar = 123, after = \\\"foooooooooooooooooooooooooooooooo\\\")\") == (kj::str(root))"
               ,(DebugComparison<const_char_(&)[69],_kj::String> *)&_kjCondition,
               (char (*) [69])
               "(middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")",
               (String *)&local_330);
    kj::Array<char>::~Array((Array<char> *)&local_330);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  local_2f8 = "( middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )";
  value_01.builder.segment = (SegmentBuilder *)root._builder.capTable;
  value_01.schema.super_Schema.raw = (Schema)(Schema)root._builder.segment;
  value_01.builder.capTable = (CapTableBuilder *)root._builder.data;
  value_01.builder.data = root._builder.pointers;
  value_01.builder.pointers = (WirePointer *)root._builder._32_8_;
  value_01.builder._32_8_ = _kjCondition.left;
  prettyPrint(value_01);
  kj::StringTree::flatten((String *)&local_348,&local_330);
  kj::_::DebugExpression<char_const(&)[75]>::operator==
            ((DebugComparison<const_char_(&)[75],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[75]> *)&local_2f8,(String *)&local_348);
  kj::Array<char>::~Array(&local_348);
  kj::StringTree::~StringTree(&local_330);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_02.builder.segment = (SegmentBuilder *)root._builder.capTable;
    value_02.schema.super_Schema.raw = (Schema)(Schema)root._builder.segment;
    value_02.builder.capTable = (CapTableBuilder *)root._builder.data;
    value_02.builder.data = root._builder.pointers;
    value_02.builder.pointers = (WirePointer *)root._builder._32_8_;
    value_02.builder._32_8_ = _kjCondition.left;
    prettyPrint(value_02);
    kj::StringTree::flatten((String *)&local_348,&local_330);
    kj::_::Debug::
    log<char_const(&)[139],kj::_::DebugComparison<char_const(&)[75],kj::String>&,char_const(&)[75],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x286,ERROR,
               "\"failed: expected \" \"(\\\"( middle = 0,\\\\n\\\" \\\"  bar = 123,\\\\n\\\" \\\"  after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\" )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\", prettyPrint(root).flatten()"
               ,(char (*) [139])
                "failed: expected (\"( middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[75],_kj::String> *)&_kjCondition,
               (char (*) [75])
               "( middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )",
               (String *)&local_348);
    kj::Array<char>::~Array(&local_348);
    kj::StringTree::~StringTree(&local_330);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  value_08.super_StringPtr.content.size_ = 7;
  value_08.super_StringPtr.content.ptr = "before";
  capnproto_test::capnp::test::TestUnnamedUnion::Builder::setBefore(&root,value_08);
  local_348.ptr =
       "(before = \"before\", middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")"
  ;
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)&local_330,(kj *)&root,params_03);
  kj::_::DebugExpression<char_const(&)[88]>::operator==
            ((DebugComparison<const_char_(&)[88],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[88]> *)&local_348,(String *)&local_330);
  kj::Array<char>::~Array((Array<char> *)&local_330);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
              ((String *)&local_330,(kj *)&root,params_04);
    kj::_::Debug::
    log<char_const(&)[135],kj::_::DebugComparison<char_const(&)[88],kj::String>&,char_const(&)[88],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x28b,ERROR,
               "\"failed: expected \" \"(\\\"(before = \\\\\\\"before\\\\\\\", middle = 0, bar = 123, \\\" \\\"after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\")\\\") == (kj::str(root))\", _kjCondition, \"(before = \\\"before\\\", middle = 0, bar = 123, \" \"after = \\\"foooooooooooooooooooooooooooooooo\\\")\", kj::str(root)"
               ,(char (*) [135])
                "failed: expected (\"(before = \\\"before\\\", middle = 0, bar = 123, \" \"after = \\\"foooooooooooooooooooooooooooooooo\\\")\") == (kj::str(root))"
               ,(DebugComparison<const_char_(&)[88],_kj::String> *)&_kjCondition,
               (char (*) [88])
               "(before = \"before\", middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")"
               ,(String *)&local_330);
    kj::Array<char>::~Array((Array<char> *)&local_330);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  local_2f8 = 
  "( before = \"before\",\n  middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
  ;
  value_03.builder.segment = (SegmentBuilder *)root._builder.capTable;
  value_03.schema.super_Schema.raw = (Schema)(Schema)root._builder.segment;
  value_03.builder.capTable = (CapTableBuilder *)root._builder.data;
  value_03.builder.data = root._builder.pointers;
  value_03.builder.pointers = (WirePointer *)root._builder._32_8_;
  value_03.builder._32_8_ = _kjCondition.left;
  prettyPrint(value_03);
  kj::StringTree::flatten((String *)&local_348,&local_330);
  kj::_::DebugExpression<char_const(&)[96]>::operator==
            ((DebugComparison<const_char_(&)[96],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[96]> *)&local_2f8,(String *)&local_348);
  kj::Array<char>::~Array(&local_348);
  kj::StringTree::~StringTree(&local_330);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_04.builder.segment = (SegmentBuilder *)root._builder.capTable;
    value_04.schema.super_Schema.raw = (Schema)(Schema)root._builder.segment;
    value_04.builder.capTable = (CapTableBuilder *)root._builder.data;
    value_04.builder.data = root._builder.pointers;
    value_04.builder.pointers = (WirePointer *)root._builder._32_8_;
    value_04.builder._32_8_ = _kjCondition.left;
    prettyPrint(value_04);
    kj::StringTree::flatten((String *)&local_348,&local_330);
    kj::_::Debug::
    log<char_const(&)[166],kj::_::DebugComparison<char_const(&)[96],kj::String>&,char_const(&)[96],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x291,ERROR,
               "\"failed: expected \" \"(\\\"( before = \\\\\\\"before\\\\\\\",\\\\n\\\" \\\"  middle = 0,\\\\n\\\" \\\"  bar = 123,\\\\n\\\" \\\"  after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\" )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( before = \\\"before\\\",\\n\" \"  middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\", prettyPrint(root).flatten()"
               ,(char (*) [166])
                "failed: expected (\"( before = \\\"before\\\",\\n\" \"  middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[96],_kj::String> *)&_kjCondition,
               (char (*) [96])
               "( before = \"before\",\n  middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
               ,(String *)&local_348);
    kj::Array<char>::~Array(&local_348);
    kj::StringTree::~StringTree(&local_330);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  *(undefined2 *)((long)root._builder.data + 4) = 0;
  *(undefined2 *)root._builder.data = 0;
  local_348.ptr =
       "(before = \"before\", foo = 0, middle = 0, after = \"foooooooooooooooooooooooooooooooo\")";
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)&local_330,(kj *)&root,params_05);
  kj::_::DebugExpression<char_const(&)[86]>::operator==
            ((DebugComparison<const_char_(&)[86],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[86]> *)&local_348,(String *)&local_330);
  kj::Array<char>::~Array((Array<char> *)&local_330);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
              ((String *)&local_330,(kj *)&root,params_06);
    kj::_::Debug::
    log<char_const(&)[130],kj::_::DebugComparison<char_const(&)[86],kj::String>&,char_const(&)[86],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x297,ERROR,
               "\"failed: expected \" \"(\\\"(before = \\\\\\\"before\\\\\\\", foo = 0, middle = 0, after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\")\\\") == (kj::str(root))\", _kjCondition, \"(before = \\\"before\\\", foo = 0, middle = 0, after = \\\"foooooooooooooooooooooooooooooooo\\\")\", kj::str(root)"
               ,(char (*) [130])
                "failed: expected (\"(before = \\\"before\\\", foo = 0, middle = 0, after = \\\"foooooooooooooooooooooooooooooooo\\\")\") == (kj::str(root))"
               ,(DebugComparison<const_char_(&)[86],_kj::String> *)&_kjCondition,
               (char (*) [86])
               "(before = \"before\", foo = 0, middle = 0, after = \"foooooooooooooooooooooooooooooooo\")"
               ,(String *)&local_330);
    kj::Array<char>::~Array((Array<char> *)&local_330);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  local_2f8 = 
  "( before = \"before\",\n  foo = 0,\n  middle = 0,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
  ;
  value_05.builder.segment = (SegmentBuilder *)root._builder.capTable;
  value_05.schema.super_Schema.raw = (Schema)(Schema)root._builder.segment;
  value_05.builder.capTable = (CapTableBuilder *)root._builder.data;
  value_05.builder.data = root._builder.pointers;
  value_05.builder.pointers = (WirePointer *)root._builder._32_8_;
  value_05.builder._32_8_ = _kjCondition.left;
  prettyPrint(value_05);
  kj::StringTree::flatten((String *)&local_348,&local_330);
  kj::_::DebugExpression<char_const(&)[94]>::operator==
            ((DebugComparison<const_char_(&)[94],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[94]> *)&local_2f8,(String *)&local_348);
  kj::Array<char>::~Array(&local_348);
  kj::StringTree::~StringTree(&local_330);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    value_06.builder.segment = (SegmentBuilder *)root._builder.capTable;
    value_06.schema.super_Schema.raw = (Schema)(Schema)root._builder.segment;
    value_06.builder.capTable = (CapTableBuilder *)root._builder.data;
    value_06.builder.data = root._builder.pointers;
    value_06.builder.pointers = (WirePointer *)root._builder._32_8_;
    value_06.builder._32_8_ = _kjCondition.left;
    prettyPrint(value_06);
    kj::StringTree::flatten((String *)&local_348,&local_330);
    kj::_::Debug::
    log<char_const(&)[164],kj::_::DebugComparison<char_const(&)[94],kj::String>&,char_const(&)[94],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x29d,ERROR,
               "\"failed: expected \" \"(\\\"( before = \\\\\\\"before\\\\\\\",\\\\n\\\" \\\"  foo = 0,\\\\n\\\" \\\"  middle = 0,\\\\n\\\" \\\"  after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\" )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( before = \\\"before\\\",\\n\" \"  foo = 0,\\n\" \"  middle = 0,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\", prettyPrint(root).flatten()"
               ,(char (*) [164])
                "failed: expected (\"( before = \\\"before\\\",\\n\" \"  foo = 0,\\n\" \"  middle = 0,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[94],_kj::String> *)&_kjCondition,
               (char (*) [94])
               "( before = \"before\",\n  foo = 0,\n  middle = 0,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
               ,(String *)&local_348);
    kj::Array<char>::~Array(&local_348);
    kj::StringTree::~StringTree(&local_330);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Stringify, UnnamedUnions) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestUnnamedUnion>();

  root.setBar(123);

  EXPECT_EQ("(middle = 0, bar = 123)", kj::str(root));
  EXPECT_EQ("(middle = 0, bar = 123)", prettyPrint(root).flatten());

  root.setAfter("foooooooooooooooooooooooooooooooo");

  EXPECT_EQ("(middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")",
            kj::str(root));
  EXPECT_EQ(
      "( middle = 0,\n"
      "  bar = 123,\n"
      "  after = \"foooooooooooooooooooooooooooooooo\" )",
      prettyPrint(root).flatten());

  root.setBefore("before");

  EXPECT_EQ("(before = \"before\", middle = 0, bar = 123, "
      "after = \"foooooooooooooooooooooooooooooooo\")", kj::str(root));
  EXPECT_EQ(
      "( before = \"before\",\n"
      "  middle = 0,\n"
      "  bar = 123,\n"
      "  after = \"foooooooooooooooooooooooooooooooo\" )",
      prettyPrint(root).flatten());

  root.setFoo(0);

  EXPECT_EQ(
      "(before = \"before\", foo = 0, middle = 0, after = \"foooooooooooooooooooooooooooooooo\")",
      kj::str(root));
  EXPECT_EQ(
      "( before = \"before\",\n"
      "  foo = 0,\n"
      "  middle = 0,\n"
      "  after = \"foooooooooooooooooooooooooooooooo\" )",
      prettyPrint(root).flatten());
}